

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

void __thiscall ON_String::TrimLeft(ON_String *this,char *s)

{
  int *piVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  ON_Internal_Empty_aString *pOVar5;
  long lVar6;
  uint uVar7;
  char cVar8;
  char *pcVar9;
  
  pcVar4 = this->m_s;
  pOVar5 = (ON_Internal_Empty_aString *)(pcVar4 + -0xc);
  if (pcVar4 == (char *)0x0) {
    pOVar5 = &empty_astring;
  }
  if (0 < (pOVar5->header).string_length) {
    if (s == (char *)0x0) {
      lVar6 = -1;
      do {
        lVar3 = lVar6 + 1;
        lVar6 = lVar6 + 1;
        if (pcVar4[lVar3] < '\x01') break;
      } while (0x5d < (byte)(pcVar4[lVar3] - 0x21U));
LAB_005b7469:
      uVar7 = (uint)lVar6;
      if (lVar6 == 0) {
        return;
      }
    }
    else {
      cVar8 = *pcVar4;
      if (cVar8 == '\0') {
        return;
      }
      lVar6 = 0;
      uVar7 = 0;
      pcVar9 = s;
LAB_005b7429:
      do {
        cVar2 = *pcVar9;
        if (cVar2 != '\0') {
          pcVar9 = pcVar9 + 1;
          if (cVar2 != cVar8) goto LAB_005b7429;
        }
        if (cVar2 == '\0') goto LAB_005b7469;
        uVar7 = uVar7 + 1;
        cVar8 = pcVar4[lVar6 + 1];
        lVar6 = lVar6 + 1;
        pcVar9 = s;
      } while (cVar8 != '\0');
    }
    if (pcVar4[uVar7] == '\0') {
      Destroy(this);
      return;
    }
    CopyArray(this);
    pcVar4 = this->m_s;
    do {
      cVar8 = pcVar4[uVar7];
      *pcVar4 = cVar8;
      pcVar4 = pcVar4 + 1;
    } while (cVar8 != '\0');
    pOVar5 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
    if (this->m_s == (char *)0x0) {
      pOVar5 = &empty_astring;
    }
    piVar1 = &(pOVar5->header).string_length;
    *piVar1 = *piVar1 - uVar7;
  }
  return;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}